

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall
QRasterPaintEngine::drawPoints(QRasterPaintEngine *this,QPointF *points,int pointCount)

{
  QPaintEngineState *pQVar1;
  QPaintEnginePrivate *pQVar2;
  QRasterPaintEngineState *s;
  long in_FS_OFFSET;
  QCosmeticStroker stroker;
  QCosmeticStroker QStack_10c8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar2 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  s = (QRasterPaintEngineState *)(pQVar1 + -2);
  if (pQVar1 == (QPaintEngineState *)0x0) {
    s = (QRasterPaintEngineState *)0x0;
  }
  ensurePen(this);
  if ((s->penData).blend != (ProcessSpans)0x0) {
    if (((uint)s->field_12 & 2) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QPaintEngineEx::drawPoints(&this->super_QPaintEngineEx,points,pointCount);
        return;
      }
      goto LAB_003779dd;
    }
    memcpy(&QStack_10c8,&DAT_005ec6c0,0x1098);
    QCosmeticStroker::QCosmeticStroker
              (&QStack_10c8,s,(QRect *)(pQVar2[3].systemTransform.m_matrix + 1),
               (QRect *)(pQVar2[3].systemTransform.m_matrix[1] + 2));
    QCosmeticStroker::drawPoints(&QStack_10c8,points,pointCount);
    QCosmeticStroker::~QCosmeticStroker(&QStack_10c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_003779dd:
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawPoints(const QPointF *points, int pointCount)
{
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    ensurePen();
    if (!s->penData.blend)
        return;

    if (!s->flags.fast_pen) {
        QPaintEngineEx::drawPoints(points, pointCount);
        return;
    }

    QCosmeticStroker stroker(s, d->deviceRect, d->deviceRectUnclipped);
    stroker.drawPoints(points, pointCount);
}